

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_id(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token;
  gtoken_t gVar2;
  char *identifier;
  char *identifier2;
  gnode_t *pgVar3;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  char *local_20;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  identifier = parse_identifier(parser);
  gravity_lexer_token(lexer);
  gVar2 = gravity_lexer_peek(lexer);
  if (gVar2 == TOK_OP_DOT) {
    gravity_lexer_next(lexer);
    identifier2 = parse_identifier(parser);
  }
  else {
    identifier2 = (char *)0x0;
  }
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar3 = (gnode_t *)0x0;
  }
  else {
    pgVar3 = parser->declarations->p[sVar1 - 1];
  }
  token._8_8_ = uStack_38;
  token._0_8_ = local_40;
  token._16_8_ = local_30;
  token._24_8_ = uStack_28;
  token.value = local_20;
  pgVar3 = gnode_identifier_expr_create(token,identifier,identifier2,pgVar3);
  return pgVar3;
}

Assistant:

static gnode_t *parse_id (gravity_parser_t *parser) {
    DECLARE_LEXER;
    const char    *identifier1 = NULL;
    const char    *identifier2 = NULL;
    gtoken_t    peek;
    gtoken_s    token;

    // IDENTIFIER |    (IDENTIFIER)('.' IDENTIFIER)

    DEBUG_PARSER("parse_id");

    identifier1 = parse_identifier(parser);

    token = gravity_lexer_token(lexer);
    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_DOT) {
        gravity_lexer_next(lexer); // consume TOK_OP_DOT
        identifier2 = parse_identifier(parser);
    }

    DEBUG_PARSER("ID: %s %s", identifier1, (identifier2) ? identifier2 : "");
    return gnode_identifier_expr_create(token, identifier1, identifier2, LAST_DECLARATION());
}